

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::ConvertToHalfPass::ProcessImpl(ConvertToHalfPass *this)

{
  Module *pMVar1;
  Instruction *this_00;
  bool bVar2;
  bool bVar3;
  uint32_t id;
  Instruction *val;
  __node_base *p_Var4;
  Instruction **ppIVar5;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:382:31)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:382:31)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  bVar2 = IRContext::ProcessReachableCallTree
                    ((this->super_Pass).context_,(ProcessFunction *)&local_40);
  if (bVar2) {
    IRContext::AddCapability((this->super_Pass).context_,Float16);
  }
  p_Var4 = &(this->relaxed_ids_set_)._M_h._M_before_begin;
  while( true ) {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) break;
    bVar3 = RemoveRelaxedDecoration(this,(uint32_t)*(size_type *)(p_Var4 + 1));
    bVar2 = (bool)(bVar2 | bVar3);
  }
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar5 = (Instruction **)
            ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (this_00 = *ppIVar5,
        this_00 !=
        (Instruction *)
        ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    id = Instruction::result_id(this_00);
    if (id != 0) {
      bVar3 = RemoveRelaxedDecoration(this,id);
      bVar2 = (bool)(bVar2 | bVar3);
    }
    ppIVar5 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return bVar2 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status ConvertToHalfPass::ProcessImpl() {
  Pass::ProcessFunction pfn = [this](Function* fp) {
    return ProcessFunction(fp);
  };
  bool modified = context()->ProcessReachableCallTree(pfn);
  // If modified, make sure module has Float16 capability
  if (modified) context()->AddCapability(spv::Capability::Float16);
  // Remove all RelaxedPrecision decorations from instructions and globals
  for (auto c_id : relaxed_ids_set_) {
    modified |= RemoveRelaxedDecoration(c_id);
  }
  for (auto& val : get_module()->types_values()) {
    uint32_t v_id = val.result_id();
    if (v_id != 0) {
      modified |= RemoveRelaxedDecoration(v_id);
    }
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}